

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void test_aes128gcm(void)

{
  uint __line;
  int iVar1;
  ptls_cipher_suite_t *ppVar2;
  ptls_cipher_suite_t *ppVar3;
  ptls_aead_context_t *ppVar4;
  size_t enc1len;
  size_t dec1len;
  size_t enc2len;
  size_t local_440;
  char enc1 [256];
  char dec1 [256];
  char dec2 [256];
  char enc2 [256];
  
  ppVar2 = find_aes128gcmsha256(ctx);
  ppVar3 = find_aes128gcmsha256(ctx_peer);
  ppVar4 = ptls_aead_new(ppVar2->aead,ppVar2->hash,1,"01234567890123456789012345678901");
  if (ppVar4 == (ptls_aead_context_t *)0x0) {
    __line = 0x55;
  }
  else {
    iVar1 = ptls_aead_transform(ppVar4,enc1,&enc1len,"hello world",0xb,'\0');
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x57);
    iVar1 = ptls_aead_transform(ppVar4,enc2,&enc2len,"good bye, all",0xd,'\0');
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x59);
    ptls_aead_free(ppVar4);
    ppVar4 = ptls_aead_new(ppVar3->aead,ppVar3->hash,0,"01234567890123456789012345678901");
    if (ppVar4 == (ptls_aead_context_t *)0x0) {
      __line = 0x5e;
    }
    else {
      iVar1 = ptls_aead_transform(ppVar4,dec1,&dec1len,enc1,enc1len,'\0');
      _ok((uint)(iVar1 == 0),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
          ,0x60);
      iVar1 = ptls_aead_transform(ppVar4,dec2,&local_440,enc2,enc2len,'\0');
      _ok((uint)(iVar1 == 0),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
          ,0x62);
      ptls_aead_free(ppVar4);
      _ok((uint)(dec1len == 0xc),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
          ,0x66);
      iVar1 = bcmp("hello world",dec1,dec1len);
      _ok((uint)(iVar1 == 0),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
          ,0x67);
      _ok((uint)(local_440 == 0xe),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
          ,0x68);
      iVar1 = bcmp("good bye, all",dec2,local_440);
      _ok((uint)(iVar1 == 0),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
          ,0x69);
      enc1[0] = enc1[0] ^ 1;
      ppVar4 = ptls_aead_new(ppVar3->aead,ppVar3->hash,0,"01234567890123456789012345678901");
      if (ppVar4 != (ptls_aead_context_t *)0x0) {
        iVar1 = ptls_aead_transform(ppVar4,dec1,&dec1len,enc1,enc1len,'\0');
        _ok((uint)(iVar1 == 0x14),"%s %d",
            "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
            ,0x70);
        ptls_aead_free(ppVar4);
        return;
      }
      __line = 0x6e;
    }
  }
  __assert_fail("c != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                ,__line,"void test_ciphersuite(ptls_cipher_suite_t *, ptls_cipher_suite_t *)");
}

Assistant:

static void test_aes128gcm(void)
{
    test_ciphersuite(find_aes128gcmsha256(ctx), find_aes128gcmsha256(ctx_peer));
}